

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_append.c
# Opt level: O1

int mpt_message_append(mpt_array *arr,mpt_message *msg)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  size_t *psVar4;
  size_t sVar5;
  
  if (arr->_buf == (mpt_buffer *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = arr->_buf->_used;
  }
  if ((msg->used == 0) ||
     (pvVar1 = mpt_array_append(arr,msg->used,msg->base), pvVar1 != (void *)0x0)) {
    lVar3 = msg->clen - 1;
    iVar2 = 0;
    if (lVar3 != 0) {
      psVar4 = &msg->cont->iov_len;
      do {
        if ((*psVar4 != 0) &&
           (pvVar1 = mpt_array_append(arr,*psVar4,((iovec *)(psVar4 + -1))->iov_base),
           pvVar1 == (void *)0x0)) goto LAB_00114eff;
        psVar4 = psVar4 + 2;
        lVar3 = lVar3 + -1;
        iVar2 = 0;
      } while (lVar3 != 0);
    }
  }
  else {
LAB_00114eff:
    if (arr->_buf != (mpt_buffer *)0x0) {
      arr->_buf->_used = sVar5;
    }
    iVar2 = -0x11;
  }
  return iVar2;
}

Assistant:

extern int mpt_message_append(MPT_STRUCT(array) *arr, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(buffer) *buf;
	struct iovec *cont;
	size_t used ,olen, clen;
	
	olen = (buf = arr->_buf) ? buf->_used : 0;
	
	/* process first message part */
	if ((used = msg->used)
	    && !mpt_array_append(arr, used, msg->base)) {
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* trailing message parts */
	cont = msg->cont;
	clen = msg->clen;
	while (--clen) {
		const uint8_t *base;
		base = cont->iov_base;
		used = cont->iov_len;
		++cont;
		/* skip empty segments */
		if (!used || mpt_array_append(arr, used, base)) {
			continue;
		}
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	return 0;
}